

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

RPCHelpMan * getblockchaininfo(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long *plVar8;
  RPCHelpMan *in_RDI;
  undefined8 uVar9;
  long lVar10;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined4 in_stack_ffffffffffffed58;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffed5c;
  undefined8 in_stack_ffffffffffffed68;
  undefined8 in_stack_ffffffffffffed70;
  undefined8 in_stack_ffffffffffffed78;
  code *pcVar12;
  undefined8 in_stack_ffffffffffffed80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffed88;
  pointer in_stack_ffffffffffffed98;
  pointer in_stack_ffffffffffffeda0;
  pointer in_stack_ffffffffffffeda8;
  _Vector_impl_data in_stack_ffffffffffffedb0;
  pointer in_stack_ffffffffffffedc8;
  pointer in_stack_ffffffffffffedd0;
  pointer in_stack_ffffffffffffedd8;
  undefined8 in_stack_ffffffffffffede0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1218;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11f8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11d8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1198;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1178;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1158;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1138;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1118;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10f8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10d8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1098;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1078;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1058;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1038;
  RPCResults local_1020;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1008;
  string local_fe8;
  string local_fc8;
  string local_fa8;
  string local_f88;
  string local_f68;
  string local_f48;
  ulong *local_f28;
  undefined8 local_f20;
  ulong local_f18;
  undefined8 uStack_f10;
  ulong *local_f08;
  size_type local_f00;
  ulong local_ef8;
  undefined8 uStack_ef0;
  long *local_ee8 [2];
  long local_ed8 [2];
  long *local_ec8 [2];
  long local_eb8 [2];
  RPCResult local_ea8;
  long *local_e20 [2];
  long local_e10 [2];
  long *local_e00 [2];
  long local_df0 [2];
  long *local_de0 [2];
  long local_dd0 [2];
  long *local_dc0 [2];
  long local_db0 [2];
  string local_da0;
  long *local_d80 [2];
  long local_d70 [2];
  long *local_d60 [2];
  long local_d50 [2];
  long *local_d40 [2];
  long local_d30 [2];
  long *local_d20 [2];
  long local_d10 [2];
  long *local_d00 [2];
  long local_cf0 [2];
  long *local_ce0 [2];
  long local_cd0 [2];
  long *local_cc0 [2];
  long local_cb0 [2];
  long *local_ca0 [2];
  long local_c90 [2];
  long *local_c80 [2];
  long local_c70 [2];
  long *local_c60 [2];
  long local_c50 [2];
  long *local_c40 [2];
  long local_c30 [2];
  long *local_c20 [2];
  long local_c10 [2];
  long *local_c00 [2];
  long local_bf0 [2];
  long *local_be0 [2];
  long local_bd0 [2];
  long *local_bc0 [2];
  long local_bb0 [2];
  long *local_ba0 [2];
  long local_b90 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  long *local_b60 [2];
  long local_b50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  long *local_b20 [2];
  long local_b10 [2];
  long *local_b00 [2];
  long local_af0 [2];
  long *local_ae0 [2];
  long local_ad0 [2];
  long *local_ac0 [2];
  long local_ab0 [2];
  long *local_aa0 [2];
  long local_a90 [2];
  long *local_a80 [2];
  long local_a70 [2];
  long *local_a60 [2];
  long local_a50 [2];
  long *local_a40 [2];
  long local_a30 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_a20;
  long *local_a00 [2];
  long local_9f0 [2];
  pointer local_9e0 [2];
  undefined1 local_9d0 [152];
  RPCResult local_938;
  RPCResult local_8b0;
  RPCResult local_828;
  RPCResult local_7a0;
  RPCResult local_718;
  RPCResult local_690;
  RPCResult local_608;
  RPCResult local_580;
  RPCResult local_4f8;
  RPCResult local_470;
  RPCResult local_3e8;
  RPCResult local_360;
  RPCResult local_2d8;
  RPCResult local_250;
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1038.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getblockchaininfo","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "Returns an object containing various state info regarding blockchain processing.\n",""
            );
  local_120[0] = local_110;
  local_1008.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1008.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1008.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_9e0[0] = (pointer)local_9d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9e0,"chain","");
  local_a00[0] = local_9f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a00,"current network name (main, test, testnet4, signet, regtest)","");
  local_1058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1058.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffed70;
  description._M_string_length = in_stack_ffffffffffffed80;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description.field_2 = in_stack_ffffffffffffed88;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffeda0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffed98;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult
            ((RPCResult *)(local_9d0 + 0x10),STR,m_key_name,description,inner,SUB81(local_9e0,0));
  local_a20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_a20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a20,"blocks","");
  local_a40[0] = local_a30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a40,
             "the height of the most-work fully-validated chain. The genesis block has height 0","")
  ;
  local_1078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1078.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_00._M_string_length = in_stack_ffffffffffffed80;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_00.field_2 = in_stack_ffffffffffffed88;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_938,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_a20,0));
  local_a60[0] = local_a50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a60,"headers","");
  local_a80[0] = local_a70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a80,"the current number of headers we have validated","");
  local_1098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1098.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_01._M_string_length = in_stack_ffffffffffffed80;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_01.field_2 = in_stack_ffffffffffffed88;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_8b0,NUM,m_key_name_01,description_01,inner_01,SUB81(local_a60,0));
  local_aa0[0] = local_a90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa0,"bestblockhash","");
  local_ac0[0] = local_ab0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ac0,"the hash of the currently best block","");
  local_10b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_02._M_string_length = in_stack_ffffffffffffed80;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_02.field_2 = in_stack_ffffffffffffed88;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_828,STR,m_key_name_02,description_02,inner_02,SUB81(local_aa0,0));
  local_ae0[0] = local_ad0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"difficulty","");
  local_b00[0] = local_af0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b00,"the current difficulty","");
  local_10d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_03._M_string_length = in_stack_ffffffffffffed80;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_03.field_2 = in_stack_ffffffffffffed88;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_7a0,NUM,m_key_name_03,description_03,inner_03,SUB81(local_ae0,0));
  local_b20[0] = local_b10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b20,"time","");
  std::operator+(&local_b40,"The block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_10f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_04._M_string_length = in_stack_ffffffffffffed80;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_04.field_2 = in_stack_ffffffffffffed88;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_718,NUM_TIME,m_key_name_04,description_04,inner_04,SUB81(local_b20,0))
  ;
  local_b60[0] = local_b50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b60,"mediantime","");
  std::operator+(&local_b80,"The median block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_1118.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1118.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1118.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_05._M_string_length = in_stack_ffffffffffffed80;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_05.field_2 = in_stack_ffffffffffffed88;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_690,NUM_TIME,m_key_name_05,description_05,inner_05,SUB81(local_b60,0))
  ;
  local_ba0[0] = local_b90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ba0,"verificationprogress","");
  local_bc0[0] = local_bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bc0,"estimate of verification progress [0..1]","");
  local_1138.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1138.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1138.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_06._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_06._M_string_length = in_stack_ffffffffffffed80;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_06.field_2 = in_stack_ffffffffffffed88;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_608,NUM,m_key_name_06,description_06,inner_06,SUB81(local_ba0,0));
  local_be0[0] = local_bd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_be0,"initialblockdownload","");
  local_c00[0] = local_bf0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c00,
             "(debug information) estimate of whether this node is in Initial Block Download mode",
             "");
  local_1158.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1158.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1158.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_07._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name_07._M_string_length = (size_type)in_RDI;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_07._M_string_length = in_stack_ffffffffffffed80;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_07.field_2 = in_stack_ffffffffffffed88;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_580,BOOL,m_key_name_07,description_07,inner_07,SUB81(local_be0,0));
  local_c20[0] = local_c10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c20,"chainwork","");
  local_c40[0] = local_c30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c40,"total amount of work in active chain, in hexadecimal","");
  local_1178.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1178.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1178.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_08._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name_08._M_string_length = (size_type)in_RDI;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_08._M_string_length = in_stack_ffffffffffffed80;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_08.field_2 = in_stack_ffffffffffffed88;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_4f8,STR_HEX,m_key_name_08,description_08,inner_08,SUB81(local_c20,0));
  local_c60[0] = local_c50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c60,"size_on_disk","");
  local_c80[0] = local_c70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c80,"the estimated size of the block and undo files on disk","");
  local_1198.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1198.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1198.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_09._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name_09._M_string_length = (size_type)in_RDI;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_09._M_string_length = in_stack_ffffffffffffed80;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_09.field_2 = in_stack_ffffffffffffed88;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_470,NUM,m_key_name_09,description_09,inner_09,SUB81(local_c60,0));
  local_ca0[0] = local_c90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ca0,"pruned","");
  local_cc0[0] = local_cb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cc0,"if the blocks are subject to pruning","");
  local_11b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_10._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed58;
  m_key_name_10._M_string_length = (size_type)in_RDI;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_10._M_string_length = in_stack_ffffffffffffed80;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_10.field_2 = in_stack_ffffffffffffed88;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_3e8,BOOL,m_key_name_10,description_10,inner_10,SUB81(local_ca0,0));
  local_ce0[0] = local_cd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ce0,"pruneheight","");
  local_d00[0] = local_cf0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d00,
             "height of the last block pruned, plus one (only present if pruning is enabled)","");
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_8_ = in_RDI;
  auVar3._0_4_ = in_stack_ffffffffffffed5c;
  auVar3._12_8_ = in_stack_ffffffffffffed68;
  auVar3._20_8_ = in_stack_ffffffffffffed70;
  auVar3._28_4_ = 0;
  description_11._M_string_length = in_stack_ffffffffffffed80;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_11.field_2 = in_stack_ffffffffffffed88;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult
            (&local_360,NUM,(string)(auVar3 << 0x20),SUB81(local_ce0,0),description_11,inner_11,true
            );
  local_d20[0] = local_d10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d20,"automatic_pruning","");
  local_d40[0] = local_d30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d40,
             "whether automatic pruning is enabled (only present if pruning is enabled)","");
  local_11f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_ffffffffffffed5c;
  auVar4._12_8_ = in_stack_ffffffffffffed68;
  auVar4._20_8_ = in_stack_ffffffffffffed70;
  auVar4._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffed80;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_12.field_2 = in_stack_ffffffffffffed88;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult
            (&local_2d8,BOOL,(string)(auVar4 << 0x20),SUB81(local_d20,0),description_12,inner_12,
             true);
  local_d60[0] = local_d50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d60,"prune_target_size","");
  local_d80[0] = local_d70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d80,
             "the target size used by pruning (only present if automatic pruning is enabled)","");
  local_1218.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1218.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1218.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = 0;
  auVar5._4_8_ = in_RDI;
  auVar5._0_4_ = in_stack_ffffffffffffed5c;
  auVar5._12_8_ = in_stack_ffffffffffffed68;
  auVar5._20_8_ = in_stack_ffffffffffffed70;
  auVar5._28_4_ = 0;
  description_13._M_string_length = in_stack_ffffffffffffed80;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_13.field_2 = in_stack_ffffffffffffed88;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult
            (&local_250,NUM,(string)(auVar5 << 0x20),SUB81(local_d60,0),description_13,inner_13,true
            );
  local_da0._M_dataplus._M_p = (pointer)&local_da0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_da0,"warnings","");
  bVar6 = IsDeprecatedRPCEnabled(&local_da0);
  if (bVar6) {
    local_dc0[0] = local_db0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_dc0,"warnings","");
    local_de0[0] = local_dd0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_de0,"any network and blockchain warnings (DEPRECATED)","");
    in_stack_ffffffffffffedc8 = (pointer)0x0;
    in_stack_ffffffffffffedd0 = (pointer)0x0;
    in_stack_ffffffffffffedd8 = (pointer)0x0;
    m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
    m_key_name_11._M_dataplus._M_p._0_4_ = uVar11;
    m_key_name_11._M_string_length = (size_type)in_RDI;
    m_key_name_11.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
    m_key_name_11.field_2._8_8_ = in_stack_ffffffffffffed70;
    description_14._M_string_length = in_stack_ffffffffffffed80;
    description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
    description_14.field_2 = in_stack_ffffffffffffed88;
    inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_ffffffffffffeda0;
    inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_ffffffffffffed98;
    inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
    RPCResult::RPCResult(&local_1c8,STR,m_key_name_11,description_14,inner_14,SUB81(local_dc0,0));
  }
  else {
    local_e00[0] = local_df0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e00,"warnings","");
    local_e20[0] = local_e10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e20,
               "any network and blockchain warnings (run with `-deprecatedrpc=warnings` to return the latest warning as a single string)"
               ,"");
    local_ec8[0] = local_eb8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ec8,"");
    local_ee8[0] = local_ed8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ee8,"warning","");
    in_stack_ffffffffffffed98 = (pointer)0x0;
    in_stack_ffffffffffffeda0 = (pointer)0x0;
    in_stack_ffffffffffffeda8 = (pointer)0x0;
    m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
    m_key_name_12._M_dataplus._M_p._0_4_ = uVar11;
    m_key_name_12._M_string_length = (size_type)in_RDI;
    m_key_name_12.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
    m_key_name_12.field_2._8_8_ = in_stack_ffffffffffffed70;
    description_15._M_string_length = in_stack_ffffffffffffed80;
    description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
    description_15.field_2 = in_stack_ffffffffffffed88;
    inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    RPCResult::RPCResult(&local_ea8,STR,m_key_name_12,description_15,inner_15,SUB81(local_ec8,0));
    __l._M_len = 1;
    __l._M_array = &local_ea8;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffedb0,__l,
               (allocator_type *)&stack0xffffffffffffed97);
    m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
    m_key_name_13._M_dataplus._M_p._0_4_ = uVar11;
    m_key_name_13._M_string_length = (size_type)in_RDI;
    m_key_name_13.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
    m_key_name_13.field_2._8_8_ = in_stack_ffffffffffffed70;
    description_16._M_string_length = in_stack_ffffffffffffed80;
    description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
    description_16.field_2._M_local_buf = in_stack_ffffffffffffed88._M_local_buf;
    inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_ffffffffffffeda0;
    inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_ffffffffffffed98;
    inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
    RPCResult::RPCResult(&local_1c8,ARR,m_key_name_13,description_16,inner_16,false);
  }
  __l_00._M_len = 0x10;
  __l_00._M_array = (iterator)(local_9d0 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1038,__l_00,(allocator_type *)&stack0xffffffffffffed96);
  m_key_name_14._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed5c;
  m_key_name_14._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name_14._M_string_length = (size_type)in_RDI;
  m_key_name_14.field_2._M_allocated_capacity = in_stack_ffffffffffffed68;
  m_key_name_14.field_2._8_8_ = in_stack_ffffffffffffed70;
  description_17._M_string_length = in_stack_ffffffffffffed80;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed78;
  description_17.field_2 = in_stack_ffffffffffffed88;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeda0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed98;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffeda8;
  RPCResult::RPCResult(&local_100,OBJ,m_key_name_14,description_17,inner_17,SUB81(local_120,0));
  result._4_4_ = in_stack_ffffffffffffed5c;
  result.m_type = uVar11;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_ffffffffffffed68;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffed70;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffed78;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffed80;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffed88;
  result._64_8_ = in_stack_ffffffffffffed98;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeda0;
  result.m_description._M_string_length = (size_type)in_stack_ffffffffffffeda8;
  result._88_24_ = in_stack_ffffffffffffedb0;
  result.m_cond._M_string_length = (size_type)in_stack_ffffffffffffedc8;
  result.m_cond.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedd0;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffedd8;
  RPCResults::RPCResults(&local_1020,result);
  local_f68._M_dataplus._M_p = (pointer)&local_f68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f68,"getblockchaininfo","");
  local_f88._M_dataplus._M_p = (pointer)&local_f88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f88,"");
  HelpExampleCli(&local_f48,&local_f68,&local_f88);
  local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fc8,"getblockchaininfo","");
  local_fe8._M_dataplus._M_p = (pointer)&local_fe8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe8,"");
  HelpExampleRpc(&local_fa8,&local_fc8,&local_fe8);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._M_dataplus._M_p != &local_f48.field_2) {
    uVar9 = local_f48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_fa8._M_string_length + local_f48._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fa8._M_dataplus._M_p != &local_fa8.field_2) {
      uVar9 = local_fa8.field_2._M_allocated_capacity;
    }
    if (local_fa8._M_string_length + local_f48._M_string_length <= (ulong)uVar9) {
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_fa8,0,0,local_f48._M_dataplus._M_p,local_f48._M_string_length);
      goto LAB_00295ad6;
    }
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_f48,local_fa8._M_dataplus._M_p,local_fa8._M_string_length);
LAB_00295ad6:
  local_f28 = &local_f18;
  puVar2 = (ulong *)(pbVar7->_M_dataplus)._M_p;
  paVar1 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_f18 = paVar1->_M_allocated_capacity;
    uStack_f10 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_f18 = paVar1->_M_allocated_capacity;
    local_f28 = puVar2;
  }
  local_f00 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar7->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_f28 == &local_f18) {
    uStack_ef0 = uStack_f10;
    local_f08 = &local_ef8;
  }
  else {
    local_f08 = local_f28;
  }
  local_ef8 = local_f18;
  local_f20 = 0;
  local_f18 = local_f18 & 0xffffffffffffff00;
  pcVar12 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1331:9)>
            ::_M_manager;
  description_18._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1331:9)>
       ::_M_invoke;
  description_18._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1331:9)>
                ::_M_manager;
  description_18.field_2 = in_stack_ffffffffffffed88;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffeda0;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffed98;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffeda8;
  examples.m_examples._M_string_length = (size_type)in_stack_ffffffffffffedd0;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffedc8;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedd8;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffede0;
  local_f28 = &local_f18;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xffffffffffffed68)),description_18,args,
             (RPCResults)in_stack_ffffffffffffedb0,examples,(RPCMethodImpl *)&local_58);
  if (pcVar12 != (code *)0x0) {
    (*pcVar12)(&stack0xffffffffffffed68,&stack0xffffffffffffed68,3);
  }
  if (local_f08 != &local_ef8) {
    operator_delete(local_f08,local_ef8 + 1);
  }
  if (local_f28 != &local_f18) {
    operator_delete(local_f28,local_f18 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != &local_fa8.field_2) {
    operator_delete(local_fa8._M_dataplus._M_p,local_fa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fe8._M_dataplus._M_p != &local_fe8.field_2) {
    operator_delete(local_fe8._M_dataplus._M_p,local_fe8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
    operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._M_dataplus._M_p != &local_f48.field_2) {
    operator_delete(local_f48._M_dataplus._M_p,local_f48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f88._M_dataplus._M_p != &local_f88.field_2) {
    operator_delete(local_f88._M_dataplus._M_p,local_f88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f68._M_dataplus._M_p != &local_f68.field_2) {
    operator_delete(local_f68._M_dataplus._M_p,local_f68.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1020.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1038);
  lVar10 = 0x880;
  do {
    if ((long *)(local_9d0 + lVar10) != *(long **)((long)local_9e0 + lVar10)) {
      operator_delete(*(long **)((long)local_9e0 + lVar10),*(long *)(local_9d0 + lVar10) + 1);
    }
    if ((long *)((long)local_9f0 + lVar10) != *(long **)((long)local_a00 + lVar10)) {
      operator_delete(*(long **)((long)local_a00 + lVar10),*(long *)((long)local_9f0 + lVar10) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_a20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar10));
    if ((long *)((long)local_a30 + lVar10) != *(long **)((long)local_a40 + lVar10)) {
      operator_delete(*(long **)((long)local_a40 + lVar10),*(long *)((long)local_a30 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  if (bVar6) {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffedc8);
    if (local_de0[0] != local_dd0) {
      operator_delete(local_de0[0],local_dd0[0] + 1);
    }
    plVar8 = local_db0;
  }
  else {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffedb0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ea8.m_cond._M_dataplus._M_p != &local_ea8.m_cond.field_2) {
      operator_delete(local_ea8.m_cond._M_dataplus._M_p,
                      local_ea8.m_cond.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ea8.m_description._M_dataplus._M_p != &local_ea8.m_description.field_2) {
      operator_delete(local_ea8.m_description._M_dataplus._M_p,
                      local_ea8.m_description.field_2._M_allocated_capacity + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ea8.m_inner);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ea8.m_key_name._M_dataplus._M_p != &local_ea8.m_key_name.field_2) {
      operator_delete(local_ea8.m_key_name._M_dataplus._M_p,
                      local_ea8.m_key_name.field_2._M_allocated_capacity + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed98);
    if (local_ee8[0] != local_ed8) {
      operator_delete(local_ee8[0],local_ed8[0] + 1);
    }
    if (local_ec8[0] != local_eb8) {
      operator_delete(local_ec8[0],local_eb8[0] + 1);
    }
    if (local_e20[0] != local_e10) {
      operator_delete(local_e20[0],local_e10[0] + 1);
    }
    plVar8 = local_df0;
  }
  if ((long *)plVar8[-2] != plVar8) {
    operator_delete((long *)plVar8[-2],*plVar8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da0._M_dataplus._M_p != &local_da0.field_2) {
    operator_delete(local_da0._M_dataplus._M_p,local_da0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1218);
  if (local_d80[0] != local_d70) {
    operator_delete(local_d80[0],local_d70[0] + 1);
  }
  if (local_d60[0] != local_d50) {
    operator_delete(local_d60[0],local_d50[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11f8);
  if (local_d40[0] != local_d30) {
    operator_delete(local_d40[0],local_d30[0] + 1);
  }
  if (local_d20[0] != local_d10) {
    operator_delete(local_d20[0],local_d10[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11d8);
  if (local_d00[0] != local_cf0) {
    operator_delete(local_d00[0],local_cf0[0] + 1);
  }
  if (local_ce0[0] != local_cd0) {
    operator_delete(local_ce0[0],local_cd0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11b8);
  if (local_cc0[0] != local_cb0) {
    operator_delete(local_cc0[0],local_cb0[0] + 1);
  }
  if (local_ca0[0] != local_c90) {
    operator_delete(local_ca0[0],local_c90[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1198);
  if (local_c80[0] != local_c70) {
    operator_delete(local_c80[0],local_c70[0] + 1);
  }
  if (local_c60[0] != local_c50) {
    operator_delete(local_c60[0],local_c50[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1178);
  if (local_c40[0] != local_c30) {
    operator_delete(local_c40[0],local_c30[0] + 1);
  }
  if (local_c20[0] != local_c10) {
    operator_delete(local_c20[0],local_c10[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1158);
  if (local_c00[0] != local_bf0) {
    operator_delete(local_c00[0],local_bf0[0] + 1);
  }
  if (local_be0[0] != local_bd0) {
    operator_delete(local_be0[0],local_bd0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1138);
  if (local_bc0[0] != local_bb0) {
    operator_delete(local_bc0[0],local_bb0[0] + 1);
  }
  if (local_ba0[0] != local_b90) {
    operator_delete(local_ba0[0],local_b90[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
    operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
  }
  if (local_b60[0] != local_b50) {
    operator_delete(local_b60[0],local_b50[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
    operator_delete(local_b40._M_dataplus._M_p,local_b40.field_2._M_allocated_capacity + 1);
  }
  if (local_b20[0] != local_b10) {
    operator_delete(local_b20[0],local_b10[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10d8);
  if (local_b00[0] != local_af0) {
    operator_delete(local_b00[0],local_af0[0] + 1);
  }
  if (local_ae0[0] != local_ad0) {
    operator_delete(local_ae0[0],local_ad0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10b8);
  if (local_ac0[0] != local_ab0) {
    operator_delete(local_ac0[0],local_ab0[0] + 1);
  }
  if (local_aa0[0] != local_a90) {
    operator_delete(local_aa0[0],local_a90[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1098);
  if (local_a80[0] != local_a70) {
    operator_delete(local_a80[0],local_a70[0] + 1);
  }
  if (local_a60[0] != local_a50) {
    operator_delete(local_a60[0],local_a50[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1078);
  if (local_a40[0] != local_a30) {
    operator_delete(local_a40[0],local_a30[0] + 1);
  }
  if (local_a20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_a20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_a20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_a20.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1058);
  if (local_a00[0] != local_9f0) {
    operator_delete(local_a00[0],local_9f0[0] + 1);
  }
  if (local_9e0[0] != (pointer)local_9d0) {
    operator_delete(local_9e0[0],local_9d0._0_8_ + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1008);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getblockchaininfo()
{
    return RPCHelpMan{"getblockchaininfo",
        "Returns an object containing various state info regarding blockchain processing.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "chain", "current network name (" LIST_CHAIN_NAMES ")"},
                {RPCResult::Type::NUM, "blocks", "the height of the most-work fully-validated chain. The genesis block has height 0"},
                {RPCResult::Type::NUM, "headers", "the current number of headers we have validated"},
                {RPCResult::Type::STR, "bestblockhash", "the hash of the currently best block"},
                {RPCResult::Type::NUM, "difficulty", "the current difficulty"},
                {RPCResult::Type::NUM_TIME, "time", "The block time expressed in " + UNIX_EPOCH_TIME},
                {RPCResult::Type::NUM_TIME, "mediantime", "The median block time expressed in " + UNIX_EPOCH_TIME},
                {RPCResult::Type::NUM, "verificationprogress", "estimate of verification progress [0..1]"},
                {RPCResult::Type::BOOL, "initialblockdownload", "(debug information) estimate of whether this node is in Initial Block Download mode"},
                {RPCResult::Type::STR_HEX, "chainwork", "total amount of work in active chain, in hexadecimal"},
                {RPCResult::Type::NUM, "size_on_disk", "the estimated size of the block and undo files on disk"},
                {RPCResult::Type::BOOL, "pruned", "if the blocks are subject to pruning"},
                {RPCResult::Type::NUM, "pruneheight", /*optional=*/true, "height of the last block pruned, plus one (only present if pruning is enabled)"},
                {RPCResult::Type::BOOL, "automatic_pruning", /*optional=*/true, "whether automatic pruning is enabled (only present if pruning is enabled)"},
                {RPCResult::Type::NUM, "prune_target_size", /*optional=*/true, "the target size used by pruning (only present if automatic pruning is enabled)"},
                (IsDeprecatedRPCEnabled("warnings") ?
                    RPCResult{RPCResult::Type::STR, "warnings", "any network and blockchain warnings (DEPRECATED)"} :
                    RPCResult{RPCResult::Type::ARR, "warnings", "any network and blockchain warnings (run with `-deprecatedrpc=warnings` to return the latest warning as a single string)",
                    {
                        {RPCResult::Type::STR, "", "warning"},
                    }
                    }
                ),
            }},
        RPCExamples{
            HelpExampleCli("getblockchaininfo", "")
            + HelpExampleRpc("getblockchaininfo", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    LOCK(cs_main);
    Chainstate& active_chainstate = chainman.ActiveChainstate();

    const CBlockIndex& tip{*CHECK_NONFATAL(active_chainstate.m_chain.Tip())};
    const int height{tip.nHeight};
    UniValue obj(UniValue::VOBJ);
    obj.pushKV("chain", chainman.GetParams().GetChainTypeString());
    obj.pushKV("blocks", height);
    obj.pushKV("headers", chainman.m_best_header ? chainman.m_best_header->nHeight : -1);
    obj.pushKV("bestblockhash", tip.GetBlockHash().GetHex());
    obj.pushKV("difficulty", GetDifficulty(tip));
    obj.pushKV("time", tip.GetBlockTime());
    obj.pushKV("mediantime", tip.GetMedianTimePast());
    obj.pushKV("verificationprogress", GuessVerificationProgress(chainman.GetParams().TxData(), &tip));
    obj.pushKV("initialblockdownload", chainman.IsInitialBlockDownload());
    obj.pushKV("chainwork", tip.nChainWork.GetHex());
    obj.pushKV("size_on_disk", chainman.m_blockman.CalculateCurrentUsage());
    obj.pushKV("pruned", chainman.m_blockman.IsPruneMode());
    if (chainman.m_blockman.IsPruneMode()) {
        const auto prune_height{GetPruneHeight(chainman.m_blockman, active_chainstate.m_chain)};
        obj.pushKV("pruneheight", prune_height ? prune_height.value() + 1 : 0);

        const bool automatic_pruning{chainman.m_blockman.GetPruneTarget() != BlockManager::PRUNE_TARGET_MANUAL};
        obj.pushKV("automatic_pruning",  automatic_pruning);
        if (automatic_pruning) {
            obj.pushKV("prune_target_size", chainman.m_blockman.GetPruneTarget());
        }
    }

    NodeContext& node = EnsureAnyNodeContext(request.context);
    obj.pushKV("warnings", node::GetWarningsForRpc(*CHECK_NONFATAL(node.warnings), IsDeprecatedRPCEnabled("warnings")));
    return obj;
},
    };
}